

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::CompressRle
               (uchar *dst,tinyexr_uint64 *compressedSize,uchar *src,unsigned_long src_size)

{
  value_type vVar1;
  char cVar2;
  int iVar3;
  reference pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ulong in_RCX;
  value_type *pvVar5;
  value_type *in_RDX;
  ulong *in_RSI;
  char *in_RDI;
  int outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  char *srcPtr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  size_type in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  allocator_type *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  value_type *local_78;
  value_type *local_68;
  reference local_60;
  value_type *local_58;
  int local_20;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x5137d6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x5137fc);
  local_60 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28);
  local_68 = pvVar4 + (in_RCX + 1 >> 1);
  local_58 = in_RDX;
  while (local_58 < in_RDX + in_RCX) {
    pvVar5 = local_58 + 1;
    *local_60 = *local_58;
    if (in_RDX + in_RCX <= pvVar5) break;
    local_58 = local_58 + 2;
    *local_68 = *pvVar5;
    local_68 = local_68 + 1;
    local_60 = local_60 + 1;
  }
  local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
  vVar1 = *local_78;
  while (local_78 = local_78 + 1,
        local_78 <
        (value_type *)
        ((long)&(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + in_RCX)) {
    cVar2 = *local_78 - vVar1;
    vVar1 = *local_78;
    *local_78 = cVar2 + 0x80;
  }
  local_20 = (int)in_RCX;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(local_20,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
  iVar3 = rleCompress(local_20,(char *)pvVar4,in_RDI);
  *in_RSI = (long)iVar3;
  if (in_RCX <= *in_RSI) {
    *in_RSI = in_RCX;
    memcpy(in_RDI,in_RDX,in_RCX);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

static void CompressRle(unsigned char *dst,
                        tinyexr::tinyexr_uint64 &compressedSize,
                        const unsigned char *src, unsigned long src_size) {
  std::vector<unsigned char> tmpBuf(src_size);

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfRleCompressor.cpp
  //

  //
  // Reorder the pixel data.
  //

  const char *srcPtr = reinterpret_cast<const char *>(src);

  {
    char *t1 = reinterpret_cast<char *>(&tmpBuf.at(0));
    char *t2 = reinterpret_cast<char *>(&tmpBuf.at(0)) + (src_size + 1) / 2;
    const char *stop = srcPtr + src_size;

    for (;;) {
      if (srcPtr < stop)
        *(t1++) = *(srcPtr++);
      else
        break;

      if (srcPtr < stop)
        *(t2++) = *(srcPtr++);
      else
        break;
    }
  }

  //
  // Predictor.
  //

  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + src_size;
    int p = t[-1];

    while (t < stop) {
      int d = int(t[0]) - p + (128 + 256);
      p = t[0];
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // outSize will be (srcSiz * 3) / 2 at max.
  int outSize = rleCompress(static_cast<int>(src_size),
                            reinterpret_cast<const char *>(&tmpBuf.at(0)),
                            reinterpret_cast<signed char *>(dst));
  assert(outSize > 0);

  compressedSize = static_cast<tinyexr::tinyexr_uint64>(outSize);

  // Use uncompressed data when compressed data is larger than uncompressed.
  // (Issue 40)
  if (compressedSize >= src_size) {
    compressedSize = src_size;
    memcpy(dst, src, src_size);
  }
}